

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syslog_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::syslog_sink<std::mutex>::syslog_sink
          (syslog_sink<std::mutex> *this,string *ident,int syslog_option,int syslog_facility,
          bool enable_formatting)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  char *local_50;
  base_sink<std::mutex> *in_stack_ffffffffffffffd0;
  
  base_sink<std::mutex>::base_sink(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__syslog_sink_009308f8;
  *(byte *)(in_RDI + 8) = in_R8B & 1;
  *(undefined8 *)((long)in_RDI + 0x44) = 0x700000007;
  *(undefined8 *)((long)in_RDI + 0x4c) = 0x400000006;
  *(undefined8 *)((long)in_RDI + 0x54) = 0x200000003;
  *(undefined4 *)((long)in_RDI + 0x5c) = 6;
  std::__cxx11::string::string
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_EDX,in_ECX));
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5c43ea);
  if (bVar1) {
    local_50 = (char *)0x0;
  }
  else {
    local_50 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5c4407
                      );
  }
  openlog(local_50,in_EDX,in_ECX);
  return;
}

Assistant:

syslog_sink(std::string ident, int syslog_option, int syslog_facility, bool enable_formatting)
        : enable_formatting_{enable_formatting},
          syslog_levels_{{/* spdlog::level::trace      */ LOG_DEBUG,
                          /* spdlog::level::debug      */ LOG_DEBUG,
                          /* spdlog::level::info       */ LOG_INFO,
                          /* spdlog::level::warn       */ LOG_WARNING,
                          /* spdlog::level::err        */ LOG_ERR,
                          /* spdlog::level::critical   */ LOG_CRIT,
                          /* spdlog::level::off        */ LOG_INFO}},
          ident_{std::move(ident)} {
        // set ident to be program name if empty
        ::openlog(ident_.empty() ? nullptr : ident_.c_str(), syslog_option, syslog_facility);
    }